

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O2

CPscl cp_decl_spec(CPState *cp,CPDecl *decl,CPscl scl)

{
  GCstr *pGVar1;
  CTState *cts;
  CType *pCVar2;
  int iVar3;
  CTypeID id;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ErrMsg em;
  uint uVar7;
  anon_union_4_2_43a9a9ed_for_CPValue_0 aVar8;
  anon_union_4_2_43a9a9ed_for_CPValue_0 aVar9;
  uint uVar10;
  CTInfo CVar11;
  uint tok;
  CTSize size;
  CTypeID CVar12;
  uint local_64;
  CPValue k;
  CTInfo local_50;
  uint local_4c;
  CType *local_38;
  
  decl->cp = cp;
  decl->mode = cp->mode;
  decl->attr = 0;
  decl->fattr = 0;
  decl->top = 0;
  decl->pos = 0;
  decl->stack[0].next = 0;
  decl->name = (GCstr *)0x0;
  decl->redir = (GCstr *)0x0;
  uVar10 = 0;
  local_4c = 0;
  local_64 = local_4c;
  uVar6 = 0;
LAB_00136a9f:
  while( true ) {
    CVar12 = 0x10;
    cp_decl_attributes(cp,decl);
    tok = cp->tok;
    uVar5 = tok - 0x10d;
    if (0x13 < uVar5) break;
    uVar4 = cp->ct->size;
    uVar7 = uVar6;
    if ((uVar4 != 0) && (uVar7 = uVar4, uVar6 != 0)) goto LAB_00136d8d;
    uVar4 = 1 << ((byte)uVar5 & 0x1f);
    uVar10 = uVar10 | (uVar4 & uVar10) * 2 & 0x40 | 1 << (uVar5 & 0x1f);
    uVar6 = uVar7;
    if (tok < 0x11c) {
      if (local_64 != 0) goto LAB_00136d8d;
    }
    else if ((scl & uVar4) == 0) {
      em = LJ_ERR_FFI_BADSCL;
LAB_00136ef7:
      cp_errmsg(cp,tok,em);
    }
    local_4c = local_64;
    cp_next(cp);
  }
  if (uVar6 == 0 && local_64 == 0) {
    if ((uVar10 & 0x7a0) == 0) {
      if (tok == 0x24) {
        local_64 = (cp->val).id;
      }
      else {
        if (tok != 0x100) {
          if (tok == 0x129) {
            local_64 = cp_struct_name(cp,decl,0x50000001);
            iVar3 = cp_opt(cp,0x7b);
            uVar6 = 0;
            if (iVar3 != 0) {
              k.field_0 = (anon_union_4_2_43a9a9ed_for_CPValue_0)0x0;
              k.id = 9;
              iVar3 = cp->tok;
              local_50 = 0x5002000a;
              aVar8.i32 = 0;
              uVar6 = 9;
              CVar12 = local_64;
              do {
                if (iVar3 != 0x100) {
                  cp_err_token(cp,0x100);
                }
                pGVar1 = cp->str;
                if ((cp->val).id != 0) {
                  cp_errmsg(cp,0,LJ_ERR_FFI_REDEF,pGVar1 + 1);
                }
                cp_next(cp);
                iVar3 = cp_opt(cp,0x3d);
                aVar9 = aVar8;
                if (iVar3 != 0) {
                  cp_expr_kint(cp,&k);
                  aVar9.i32 = k.field_0.i32;
                  if (k.id == 10) {
                    if (k.field_0.i32 < 0) {
                      uVar6 = 10;
                      goto LAB_00136c1b;
                    }
                  }
                  else if (k.field_0.i32 < 0) {
                    local_50 = 0x50020009;
                  }
                  k.id = 9;
                  uVar6 = 9;
                }
LAB_00136c1b:
                id = lj_ctype_new(cp->cts,&local_38);
                cts = cp->cts;
                cts->tab[CVar12].sib = (CTypeID1)id;
                pGVar1->marked = pGVar1->marked | 0x20;
                (local_38->name).gcptr32 = (uint32_t)pGVar1;
                local_38->info = (uVar6 | 0x2000000) + 0xb0000000;
                aVar8.i32 = aVar9.i32 + 1;
                k.field_0.i32 = aVar8.i32;
                local_38->size = (CTSize)aVar9;
                lj_ctype_addname(cts,local_38,id);
                iVar3 = cp_opt(cp,0x2c);
              } while ((iVar3 != 0) && (iVar3 = cp->tok, CVar12 = id, iVar3 != 0x7d));
              cp_check(cp,0x7d);
              pCVar2 = cp->cts->tab;
              pCVar2[local_64].info = local_50;
              pCVar2[local_64].size = 4;
              uVar6 = 0;
            }
          }
          else {
            if (tok == 0x128) {
              CVar11 = 0x10800000;
            }
            else {
              if (tok != 0x127) goto LAB_00136d77;
              CVar11 = 0x10000000;
            }
            local_64 = cp_decl_struct(cp,decl,CVar11);
            uVar6 = 0;
          }
          goto LAB_00136a9f;
        }
        local_64 = cp->ct->info;
        if ((local_64 & 0xf0000000) != 0x70000000) {
LAB_00136d77:
          uVar6 = 0;
          local_4c = 0;
          goto LAB_00136d9c;
        }
        local_64 = local_64 & 0xffff;
      }
      cp_next(cp);
      uVar6 = 0;
      goto LAB_00136a9f;
    }
    uVar6 = 0;
  }
  else {
LAB_00136d8d:
    CVar12 = (uVar6 != 4) + 0xf;
    local_4c = local_64;
  }
LAB_00136d9c:
  if ((uVar10 >> 8 & 1) != 0) {
    local_4c = CVar12;
  }
  if (local_4c != 0) {
    cp_push_type(decl,local_4c);
    uVar6 = decl->attr;
    goto LAB_00136e8a;
  }
  if ((uVar10 & 1) != 0) {
    CVar11 = decl->attr & 0x3000000 | 0x40000000;
    size = 0xffffffff;
    goto LAB_00136e75;
  }
  uVar5 = (uVar10 & 0x400) << 0xd;
  if ((uVar10 & 2) == 0) {
    if ((uVar10 & 0x10) == 0) {
      size = uVar6;
      if ((uVar10 & 4) == 0) {
        if ((char)uVar10 < '\0') {
          size = 2;
        }
        else {
          size = 8;
          if ((uVar10 & 0x40) == 0) {
            if ((uVar10 & 0x20) == 0) {
              size = uVar6;
              if (uVar6 == 0) {
                if ((uVar10 & 0x600) == 0) {
                  em = LJ_ERR_FFI_DECLSPEC;
                  goto LAB_00136ef7;
                }
                size = 4;
              }
            }
            else {
              uVar5 = uVar5 | 0x400000;
            }
          }
        }
      }
    }
    else {
      size = 0x10;
      if ((uVar10 & 0x20) == 0) {
        size = uVar6;
      }
      uVar5 = 0x4000000;
    }
  }
  else {
    if ((uVar10 & 0xfff079f4) != 0) {
      tok = 0;
      em = LJ_ERR_FFI_INVTYPE;
      goto LAB_00136ef7;
    }
    uVar5 = uVar5 | 0x8000000;
    if ((uVar10 >> 9 & 1) == 0) {
      uVar5 = 0x8800000;
    }
    size = uVar6 + (uVar6 == 0);
  }
  iVar3 = 0x1f;
  if (size != 0) {
    for (; size >> iVar3 == 0; iVar3 = iVar3 + -1) {
    }
  }
  CVar11 = (decl->attr & 0x3000000) + uVar5 + iVar3 * 0x10000;
LAB_00136e75:
  cp_push(decl,CVar11,size);
  uVar6 = decl->attr & 0xfcffffff;
  decl->attr = uVar6;
LAB_00136e8a:
  decl->specpos = decl->pos;
  decl->specattr = uVar6;
  decl->specfattr = decl->fattr;
  return uVar10 & 0xf8000;
}

Assistant:

static CPscl cp_decl_spec(CPState *cp, CPDecl *decl, CPscl scl)
{
  uint32_t cds = 0, sz = 0;
  CTypeID tdef = 0;

  decl->cp = cp;
  decl->mode = cp->mode;
  decl->name = NULL;
  decl->redir = NULL;
  decl->attr = 0;
  decl->fattr = 0;
  decl->pos = decl->top = 0;
  decl->stack[0].next = 0;

  for (;;) {  /* Parse basic types. */
    cp_decl_attributes(cp, decl);
    if (cp->tok >= CTOK_FIRSTDECL && cp->tok <= CTOK_LASTDECLFLAG) {
      uint32_t cbit;
      if (cp->ct->size) {
	if (sz) goto end_decl;
	sz = cp->ct->size;
      }
      cbit = (1u << (cp->tok - CTOK_FIRSTDECL));
      cds = cds | cbit | ((cbit & cds & CDF_LONG) << 1);
      if (cp->tok >= CTOK_FIRSTSCL) {
	if (!(scl & cbit)) cp_errmsg(cp, cp->tok, LJ_ERR_FFI_BADSCL);
      } else if (tdef) {
	goto end_decl;
      }
      cp_next(cp);
      continue;
    }
    if (sz || tdef ||
	(cds & (CDF_SHORT|CDF_LONG|CDF_SIGNED|CDF_UNSIGNED|CDF_COMPLEX)))
      break;
    switch (cp->tok) {
    case CTOK_STRUCT:
      tdef = cp_decl_struct(cp, decl, CTINFO(CT_STRUCT, 0));
      continue;
    case CTOK_UNION:
      tdef = cp_decl_struct(cp, decl, CTINFO(CT_STRUCT, CTF_UNION));
      continue;
    case CTOK_ENUM:
      tdef = cp_decl_enum(cp, decl);
      continue;
    case CTOK_IDENT:
      if (ctype_istypedef(cp->ct->info)) {
	tdef = ctype_cid(cp->ct->info);  /* Get typedef. */
	cp_next(cp);
	continue;
      }
      break;
    case '$':
      tdef = cp->val.id;
      cp_next(cp);
      continue;
    default:
      break;
    }
    break;
  }
end_decl:

  if ((cds & CDF_COMPLEX))  /* Use predefined complex types. */
    tdef = sz == 4 ? CTID_COMPLEX_FLOAT : CTID_COMPLEX_DOUBLE;

  if (tdef) {
    cp_push_type(decl, tdef);
  } else if ((cds & CDF_VOID)) {
    cp_push(decl, CTINFO(CT_VOID, (decl->attr & CTF_QUAL)), CTSIZE_INVALID);
    decl->attr &= ~CTF_QUAL;
  } else {
    /* Determine type info and size. */
    CTInfo info = CTINFO(CT_NUM, (cds & CDF_UNSIGNED) ? CTF_UNSIGNED : 0);
    if ((cds & CDF_BOOL)) {
      if ((cds & ~(CDF_SCL|CDF_BOOL|CDF_INT|CDF_SIGNED|CDF_UNSIGNED)))
	cp_errmsg(cp, 0, LJ_ERR_FFI_INVTYPE);
      info |= CTF_BOOL;
      if (!(cds & CDF_SIGNED)) info |= CTF_UNSIGNED;
      if (!sz) {
	sz = 1;
      }
    } else if ((cds & CDF_FP)) {
      info = CTINFO(CT_NUM, CTF_FP);
      if ((cds & CDF_LONG)) sz = sizeof(long double);
    } else if ((cds & CDF_CHAR)) {
      if ((cds & (CDF_CHAR|CDF_SIGNED|CDF_UNSIGNED)) == CDF_CHAR)
	info |= CTF_UCHAR;  /* Handle platforms where char is unsigned. */
    } else if ((cds & CDF_SHORT)) {
      sz = sizeof(short);
    } else if ((cds & CDF_LONGLONG)) {
      sz = 8;
    } else if ((cds & CDF_LONG)) {
      info |= CTF_LONG;
      sz = sizeof(long);
    } else if (!sz) {
      if (!(cds & (CDF_SIGNED|CDF_UNSIGNED)))
	cp_errmsg(cp, cp->tok, LJ_ERR_FFI_DECLSPEC);
      sz = sizeof(int);
    }
    lj_assertCP(sz != 0, "basic ctype with zero size");
    info += CTALIGN(lj_fls(sz));  /* Use natural alignment. */
    info += (decl->attr & CTF_QUAL);  /* Merge qualifiers. */
    cp_push(decl, info, sz);
    decl->attr &= ~CTF_QUAL;
  }
  decl->specpos = decl->pos;
  decl->specattr = decl->attr;
  decl->specfattr = decl->fattr;
  return (cds & CDF_SCL);  /* Return storage class. */
}